

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::StreamingListener::UrlEncode_abi_cxx11_
          (string *__return_storage_ptr__,StreamingListener *this,char *str)

{
  byte bVar1;
  ulong uVar2;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 uVar3;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  strlen((char *)this);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  uVar3 = extraout_RDX;
  do {
    bVar1 = *(byte *)&(this->super_EmptyTestEventListener).super_TestEventListener.
                      _vptr_TestEventListener;
    uVar2 = (ulong)bVar1;
    if (uVar2 < 0x3e) {
      if ((0x2000006000000400U >> (uVar2 & 0x3f) & 1) == 0) {
        if (uVar2 == 0) {
          return __return_storage_ptr__;
        }
        goto LAB_0014cba0;
      }
      String::FormatByte_abi_cxx11_(&local_70,(String *)(ulong)bVar1,(uchar)uVar3);
      std::operator+(&local_50,"%",&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      uVar3 = extraout_RDX_00;
    }
    else {
LAB_0014cba0:
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      uVar3 = extraout_RDX_01;
    }
    this = (StreamingListener *)
           ((long)&(this->super_EmptyTestEventListener).super_TestEventListener.
                   _vptr_TestEventListener + 1);
  } while( true );
}

Assistant:

string StreamingListener::UrlEncode(const char* str) {
  string result;
  result.reserve(strlen(str) + 1);
  for (char ch = *str; ch != '\0'; ch = *++str) {
    switch (ch) {
      case '%':
      case '=':
      case '&':
      case '\n':
        result.append("%" + String::FormatByte(static_cast<unsigned char>(ch)));
        break;
      default:
        result.push_back(ch);
        break;
    }
  }
  return result;
}